

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::splitUpTo
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char in_CL;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong extraout_RDX;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  VerySimpleReadOnlyString VVar9;
  
  uVar1 = find->length;
  __s = find->data;
  uVar8 = *(uint *)((long *)CONCAT71(in_register_00000011,includeFind) + 1);
  uVar5 = 0;
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    if (uVar2 < uVar1) {
      uVar6 = uVar1;
    }
    uVar7 = 0;
LAB_0010e935:
    if (uVar6 + (int)uVar5 == uVar7) goto LAB_0010e95f;
    if (*(char *)(*(long *)CONCAT71(in_register_00000011,includeFind) + (ulong)uVar7) ==
        __s[uVar2 + uVar7]) break;
    uVar2 = uVar2 + 1;
    uVar5 = (ulong)((int)uVar5 - 1);
  } while( true );
  uVar7 = uVar7 + 1;
  if (uVar8 == uVar7) {
    if (uVar2 == uVar1) {
LAB_0010e95f:
      this->data = __s;
      this->length = uVar1;
      iVar3 = 0;
      uVar8 = uVar1;
    }
    else {
      uVar8 = uVar8 + uVar2;
      if (in_CL != '\0') {
        uVar2 = uVar8;
      }
      this->data = __s;
      if (uVar2 == 0xffffffff) {
        sVar4 = strlen(__s);
        uVar2 = (uint)sVar4;
        uVar5 = extraout_RDX;
      }
      this->length = uVar2;
      iVar3 = uVar1 - uVar8;
    }
    find->data = __s + (int)uVar8;
    find->length = iVar3;
    VVar9._8_8_ = uVar5;
    VVar9.data = (tCharPtr)this;
    return VVar9;
  }
  goto LAB_0010e935;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::splitUpTo(const VerySimpleReadOnlyString & find, const bool includeFind)
    {
	    const unsigned int pos = Find(find);
	    if (pos == (unsigned int)length)
	    {
            VerySimpleReadOnlyString ret(*this);
            (void)Mutate(data + length, 0);
            return ret;
	    }
	    const int size = pos + find.length;
	    VerySimpleReadOnlyString ret(data, includeFind ? size : pos);
        (void)Mutate(data+size, length - size);
	    return ret;
    }